

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  OfType OVar1;
  pointer pcVar2;
  pointer pMVar3;
  undefined8 uVar4;
  bool bVar5;
  char *pcVar6;
  XmlWriter *writer;
  MessageInfo *msg;
  pointer pMVar7;
  ReusableStringStream rss;
  string elementName;
  ScopedElement e;
  char local_c9;
  undefined1 local_c8 [32];
  size_t local_a8;
  ReusableStringStream local_98;
  string local_80;
  string local_60;
  ScopedElement local_40;
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar1 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  pcVar6 = "failure";
  if (OVar1 < Exception) {
    if (1 < (uint)(OVar1 + ~FailureBit)) {
      if ((OVar1 != Unknown) && (OVar1 != FailureBit)) goto LAB_0017bf85;
LAB_0017bf4d:
      pcVar6 = "internalError";
    }
  }
  else {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto LAB_0017bf4d;
      if (OVar1 != ThrewException) goto LAB_0017bf85;
    }
    else {
      if (OVar1 == DidntThrowException) goto LAB_0017bf77;
      if (OVar1 != FatalErrorCondition) goto LAB_0017bf85;
    }
    pcVar6 = "error";
  }
LAB_0017bf77:
  std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar6);
LAB_0017bf85:
  writer = &this->xml;
  XmlWriter::ScopedElement::ScopedElement(&local_40,writer,Newline|Indent);
  XmlWriter::startElement(writer,&local_60,Newline|Indent);
  pcVar6 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"message","");
  this_00 = &stats->assertionResult;
  AssertionResult::getExpression_abi_cxx11_(&local_80,this_00);
  XmlWriter::writeAttribute(writer,(string *)local_c8,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_c8._0_8_ != pcVar6) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"type","");
  local_80._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_80._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(writer,(string *)local_c8,(StringRef *)&local_80);
  if ((char *)local_c8._0_8_ != pcVar6) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  ReusableStringStream::ReusableStringStream(&local_98);
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_c8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,local_c8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_c8,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_98.m_oss,(char *)local_c8._0_8_,local_c8._8_8_);
      if ((char *)local_c8._0_8_ != pcVar6) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      local_c8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,local_c8,1);
    }
    bVar5 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_80,this_00);
      clara::TextFlow::Column::Column((Column *)local_c8,&local_80);
      local_a8 = 2;
      clara::TextFlow::operator<<(local_98.m_oss,(Column *)local_c8);
      local_c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,&local_c9,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_c8._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar2,
             pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
  uVar4 = local_c8._8_8_;
  if ((char *)local_c8._0_8_ != pcVar6) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar2,
               pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_98.m_oss,(char *)local_c8._0_8_,local_c8._8_8_);
    local_80._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,(char *)&local_80,1);
    if ((char *)local_c8._0_8_ != pcVar6) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  pMVar7 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar7 != pMVar3) {
    do {
      if (pMVar7->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_98.m_oss,(pMVar7->message)._M_dataplus._M_p,
                   (pMVar7->message)._M_string_length);
        local_c8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,local_c8,1);
      }
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_98.m_oss,"at ",3);
  local_c8._0_8_ = (stats->assertionResult).m_info.lineInfo.file;
  local_c8._8_8_ = (stats->assertionResult).m_info.lineInfo.line;
  operator<<(local_98.m_oss,(SourceLineInfo *)local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(writer,(string *)local_c8,Newline);
  if ((char *)local_c8._0_8_ != pcVar6) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_98);
  XmlWriter::ScopedElement::~ScopedElement(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }